

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

base_learner * boosting_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  pointer pfVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  boosting *location;
  option_group_definition *poVar6;
  typed_option<float> *op;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_00;
  long *plVar7;
  ostream *poVar8;
  base_learner *pbVar9;
  single_learner *__src;
  learner<boosting,_example> *__dest;
  code *pcVar10;
  vw_exception *this;
  string *location_00;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  stringstream __msg;
  long *local_458;
  long local_450;
  long local_448 [2];
  _func_int ***local_438;
  _func_int **local_430;
  _func_int **local_428 [2];
  pointer *local_418;
  pointer local_410;
  pointer local_408 [2];
  long local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  option_group_definition local_370;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined1 local_320;
  string local_318;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  typed_option<float> local_258;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  string local_188 [64];
  bool local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  
  location = calloc_or_throw<boosting>(1);
  location->N = 0;
  location->gamma = 0.0;
  (location->alg)._M_dataplus._M_p = (pointer)0x0;
  (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&location->t = 0;
  (location->alg)._M_string_length = 0;
  (location->alg).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(location->alg).field_2 + 8) = 0;
  location->all = (vw *)0x0;
  (location->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (location->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (location->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (location->alg)._M_dataplus._M_p = (pointer)&(location->alg).field_2;
  (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_328 = 0x676e6974736f6f42;
  local_330 = 8;
  local_320 = 0;
  local_370.m_name._M_dataplus._M_p = (pointer)&local_370.m_name.field_2;
  local_338 = &local_328;
  std::__cxx11::string::_M_construct<char*>((string *)&local_370,&local_328);
  local_370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390.field_2._M_allocated_capacity = 0x676e6974736f6f62;
  local_390._M_string_length = 8;
  local_390.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)local_1b8,&local_390,&location->N);
  local_148 = true;
  local_418 = local_408;
  local_258.super_base_option._vptr_base_option = (_func_int **)0x26;
  local_418 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_258);
  local_408[0] = (pointer)local_258.super_base_option._vptr_base_option;
  local_418[2] = (pointer)0x3e4e3c2068746977;
  local_418[3] = (pointer)0x656c206b61657720;
  *local_418 = (pointer)0x6220656e696c6e4f;
  local_418[1] = (pointer)0x20676e6974736f6f;
  builtin_strncpy((char *)((long)local_418 + 0x1e),"learners",8);
  local_410 = (pointer)local_258.super_base_option._vptr_base_option;
  *(char *)((long)local_418 + (long)local_258.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign(local_188);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                     (&local_370,(typed_option<int> *)local_1b8);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_4_ = 0x6d6d6167;
  local_3b0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_3b0._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_258,&local_3b0,&location->gamma);
  op = VW::config::typed_option<float>::default_value(&local_258,0.1);
  local_438 = local_428;
  local_2f8.super_base_option._vptr_base_option = (_func_int **)0x33;
  local_438 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)&local_2f8);
  local_428[0] = local_2f8.super_base_option._vptr_base_option;
  local_438[4] = (_func_int **)0x796220796c6e6f20;
  local_438[5] = (_func_int **)0x20656e696c6e6f20;
  local_438[2] = (_func_int **)0x2e303d2820656764;
  local_438[3] = (_func_int **)0x64657375202c2931;
  *local_438 = (_func_int **)0x61656c206b616577;
  local_438[1] = (_func_int **)0x6520732772656e72;
  builtin_strncpy((char *)((long)local_438 + 0x2f)," BBM",4);
  local_430 = local_2f8.super_base_option._vptr_base_option;
  *(char *)((long)local_438 + (long)local_2f8.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar6,op);
  location_00 = &location->alg;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0.field_2._M_allocated_capacity._0_4_ = 0x676c61;
  local_3d0._M_string_length = 3;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2f8,&local_3d0,location_00);
  local_2f8.super_base_option.m_keep = true;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_4_ = 0x4d4242;
  local_3f0._M_string_length = 3;
  op_00 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_2f8,&local_3f0);
  local_458 = local_448;
  local_3f8 = 0x5f;
  plVar7 = (long *)std::__cxx11::string::_M_create((ulong *)&local_458,(ulong)&local_3f8);
  lVar3 = local_3f8;
  local_448[0] = local_3f8;
  local_458 = plVar7;
  memcpy(plVar7,
         "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
         ,0x5f);
  local_450 = lVar3;
  *(undefined1 *)((long)plVar7 + lVar3) = 0;
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar6,op_00);
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_2f8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6158;
  if (local_2f8.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2f8.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2f8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  local_258.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d6200;
  if (local_258.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_258.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_258.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  local_1b8._0_8_ = &PTR__typed_option_002d62a8;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_370);
  local_1a8._0_8_ = (pointer)0x676e6974736f6f62;
  local_1b8._8_8_ = (pointer)0x8;
  local_1a8[8] = '\0';
  local_1b8._0_8_ = (pointer)local_1a8;
  iVar5 = (*options->_vptr_options_i[1])(options,local_1b8);
  if ((pointer)local_1b8._0_8_ != (pointer)local_1a8) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    __dest = (learner<boosting,_example> *)0x0;
  }
  else {
    bVar4 = all->quiet;
    if ((bool)bVar4 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of weak learners = ",0x1a);
      plVar7 = (long *)std::ostream::operator<<(&std::cerr,location->N);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      bVar4 = all->quiet;
    }
    if ((bVar4 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Gamma = ",8);
      poVar8 = std::ostream::_M_insert<double>((double)location->gamma);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    iVar5 = location->N;
    local_418 = (pointer *)0xffffffffffffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_2f8,(long)iVar5,
               (value_type_conflict6 *)&local_418,(allocator_type *)&local_438);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&local_258,(long)iVar5,(value_type *)&local_2f8,(allocator_type *)&local_458);
    local_1a8._0_8_ =
         (location->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (location->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_258.super_base_option.m_name._M_string_length;
    local_1b8._0_8_ =
         (location->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1b8._8_8_ =
         (location->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (location->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_258.super_base_option._vptr_base_option;
    (location->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_258.super_base_option.m_name._M_dataplus._M_p;
    local_258.super_base_option._vptr_base_option = (_func_int **)0x0;
    local_258.super_base_option.m_name._M_dataplus._M_p = (pointer)0x0;
    local_258.super_base_option.m_name._M_string_length = 0;
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)local_1b8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&local_258);
    if (local_2f8.super_base_option._vptr_base_option != (_func_int **)0x0) {
      operator_delete(local_2f8.super_base_option._vptr_base_option);
    }
    location->t = 0;
    location->all = all;
    local_258.super_base_option._vptr_base_option =
         (_func_int **)((ulong)local_258.super_base_option._vptr_base_option & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_1b8,(long)location->N,
               (value_type_conflict3 *)&local_258,(allocator_type *)&local_2f8);
    pfVar2 = (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
    (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
    (location->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8._0_8_;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8._0_8_ = (pointer)0x0;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    local_258.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_258.super_base_option._vptr_base_option._4_4_,0x3f800000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_1b8,(long)location->N,
               (value_type_conflict3 *)&local_258,(allocator_type *)&local_2f8);
    pfVar2 = (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_1b8._0_8_;
    (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1b8._8_8_;
    (location->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_1a8._0_8_;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8._0_8_ = (pointer)0x0;
    if (pfVar2 != (pointer)0x0) {
      operator_delete(pfVar2);
      if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)location_00);
    if (iVar5 == 0) {
      pbVar9 = setup_base(options,all);
      __src = LEARNER::as_singleline<char,char>(pbVar9);
      iVar5 = location->N;
      uVar1 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<boosting,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(boosting **)(__dest + 0xb8) = location;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(long *)(__dest + 0xd8) = (long)iVar5;
      *(long *)(__dest + 0xe0) = (long)iVar5 * *(long *)(__src + 0xe0);
      *(boosting **)(__dest + 0x18) = location;
      *(code **)(__dest + 0x28) = predict_or_learn<true>;
      *(code **)(__dest + 0x38) = predict_or_learn<true>;
      *(code **)(__dest + 0x30) = predict_or_learn<false>;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar1;
      __dest[0xe8] = (learner<boosting,_example>)0x0;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)location_00);
      if (iVar5 == 0) {
        pbVar9 = setup_base(options,all);
        __src = LEARNER::as_singleline<char,char>(pbVar9);
        iVar5 = location->N;
        uVar1 = *(undefined4 *)(__src + 0xd0);
        __dest = calloc_or_throw<LEARNER::learner<boosting,example>>(1);
        memcpy(__dest,__src,0xe9);
        *(single_learner **)(__dest + 0x20) = __src;
        *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
        *(boosting **)(__dest + 0xb8) = location;
        *(single_learner **)(__dest + 0xc0) = __src;
        *(code **)(__dest + 200) = LEARNER::noop;
        *(long *)(__dest + 0xd8) = (long)iVar5;
        *(long *)(__dest + 0xe0) = (long)iVar5 * *(long *)(__src + 0xe0);
        *(boosting **)(__dest + 0x18) = location;
        *(code **)(__dest + 0x28) = predict_or_learn_logistic<true>;
        *(code **)(__dest + 0x38) = predict_or_learn_logistic<true>;
        *(code **)(__dest + 0x30) = predict_or_learn_logistic<false>;
        *(undefined8 *)(__dest + 0x40) = 0;
        *(undefined4 *)(__dest + 0xd0) = uVar1;
        __dest[0xe8] = (learner<boosting,_example>)0x0;
        pcVar10 = save_load;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)location_00);
        if (iVar5 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unrecognized boosting algorithm: \'",0x22);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(location->alg)._M_dataplus._M_p,
                              (location->alg)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' Bailing!",10);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/boosting.cc"
                     ,0x1c3,&local_318);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pbVar9 = setup_base(options,all);
        __src = LEARNER::as_singleline<char,char>(pbVar9);
        iVar5 = location->N;
        uVar1 = *(undefined4 *)(__src + 0xd0);
        __dest = calloc_or_throw<LEARNER::learner<boosting,example>>(1);
        memcpy(__dest,__src,0xe9);
        *(single_learner **)(__dest + 0x20) = __src;
        *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
        *(boosting **)(__dest + 0xb8) = location;
        *(single_learner **)(__dest + 0xc0) = __src;
        *(code **)(__dest + 200) = LEARNER::noop;
        *(long *)(__dest + 0xd8) = (long)iVar5;
        *(long *)(__dest + 0xe0) = (long)iVar5 * *(long *)(__src + 0xe0);
        *(boosting **)(__dest + 0x18) = location;
        *(code **)(__dest + 0x28) = predict_or_learn_adaptive<true>;
        *(code **)(__dest + 0x38) = predict_or_learn_adaptive<true>;
        *(code **)(__dest + 0x30) = predict_or_learn_adaptive<false>;
        *(undefined8 *)(__dest + 0x40) = 0;
        *(undefined4 *)(__dest + 0xd0) = uVar1;
        __dest[0xe8] = (learner<boosting,_example>)0x0;
        pcVar10 = save_load_sampling;
      }
      *(code **)(__dest + 0x80) = pcVar10;
      *(boosting **)(__dest + 0x70) = location;
      *(single_learner **)(__dest + 0x78) = __src;
    }
    *(boosting **)(__dest + 0xb8) = location;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    *(boosting **)(__dest + 0x58) = location;
    *(code **)(__dest + 0x68) = return_example;
    location = (boosting *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_370.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.m_name._M_dataplus._M_p != &local_370.m_name.field_2) {
    operator_delete(local_370.m_name._M_dataplus._M_p);
  }
  if (location != (boosting *)0x0) {
    destroy_free<boosting>(location);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}